

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsMetaDataCompare(FmsMetaData lhs,FmsMetaData rhs)

{
  ulong uVar1;
  int iVar2;
  FmsInt FVar3;
  FmsMetaData in_RSI;
  FmsMetaData in_RDI;
  FmsInt i;
  FmsInt NE;
  FmsMetaData *rdata;
  FmsMetaData *ldata;
  int diff;
  void *in_stack_00000040;
  void *in_stack_00000048;
  FmsInt in_stack_00000050;
  FmsScalarType in_stack_0000005c;
  ulong local_40;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  if (in_RDI == in_RSI) {
    local_4 = 0;
  }
  else if (in_RDI == (FmsMetaData)0x0) {
    local_4 = -1;
  }
  else if (in_RSI == (FmsMetaData)0x0) {
    local_4 = -2;
  }
  else {
    local_4 = 0;
    if ((in_RDI->name == (char *)0x0) || (in_RSI->name == (char *)0x0)) {
      if (in_RDI->name == (char *)0x0) {
        local_4 = 2;
      }
      else if (in_RSI->name == (char *)0x0) {
        local_4 = 3;
      }
    }
    else {
      iVar2 = strcmp(in_RDI->name,in_RSI->name);
      if (iVar2 != 0) {
        local_4 = local_4 + 1;
      }
    }
    if (in_RDI->md_type != in_RSI->md_type) {
      local_4 = local_4 + 10;
    }
    if (local_4 == 0) {
      switch(in_RDI->md_type) {
      case FMS_INTEGER:
        if ((in_RDI->sub_type).int_type != (in_RSI->sub_type).int_type) {
          local_4 = 100;
        }
        if (in_RDI->num_entries != in_RSI->num_entries) {
          local_4 = local_4 + 1000;
        }
        if ((local_4 == 0) &&
           (FVar3 = CompareIntData(in_stack_0000005c,in_stack_00000050,in_stack_00000048,
                                   in_stack_00000040), FVar3 != 0)) {
          local_4 = local_4 + 100000;
        }
        break;
      case FMS_SCALAR:
        if ((in_RDI->sub_type).int_type != (in_RSI->sub_type).int_type) {
          local_4 = 100;
        }
        if (in_RDI->num_entries != in_RSI->num_entries) {
          local_4 = local_4 + 1000;
        }
        if ((local_4 == 0) &&
           (FVar3 = CompareScalarData(in_stack_0000005c,in_stack_00000050,in_stack_00000048,
                                      in_stack_00000040), FVar3 != 0)) {
          local_4 = local_4 + 100000;
        }
        break;
      case FMS_STRING:
        if ((in_RDI->data == (void *)0x0) || (in_RSI->data == (void *)0x0)) {
          if (in_RDI->name == (char *)0x0) {
            local_4 = 100;
          }
          else if (in_RSI->name == (char *)0x0) {
            local_4 = 200;
          }
        }
        else {
          iVar2 = strcmp((char *)in_RDI->data,(char *)in_RSI->data);
          if (iVar2 != 0) {
            local_4 = local_4 + 100000;
          }
        }
        break;
      case FMS_META_DATA:
        if (in_RDI->num_entries != in_RSI->num_entries) {
          local_4 = 100;
        }
        if (local_4 == 0) {
          uVar1 = in_RDI->num_entries;
          for (local_40 = 0; local_40 < uVar1; local_40 = local_40 + 1) {
            iVar2 = FmsMetaDataCompare(in_RSI,(FmsMetaData)
                                              CONCAT44(local_4,in_stack_ffffffffffffffe0));
            if (iVar2 + local_4 != 0) {
              return iVar2 + local_4;
            }
            local_4 = 0;
          }
        }
        break;
      default:
        local_4 = 1000000;
      }
    }
  }
  return local_4;
}

Assistant:

int FmsMetaDataCompare(FmsMetaData lhs, FmsMetaData rhs) {
  if(lhs == rhs) return 0;
  if(!lhs) return -1;
  if(!rhs) return -2;
  int diff = 0;

  // It's possible for metadata not to have a name (because it was never set)
  if(lhs->name && rhs->name) {
    if(strcmp(lhs->name, rhs->name))
      diff += 1;
  } else if(!lhs->name)
    diff += 2;
  else if(!rhs->name)
    diff += 3;
  // If they are both null then they are the same

  if(lhs->md_type != rhs->md_type) {
    diff += 10;
  }

  // Only compare the data is everything has been the same so far
  if(diff == 0) {
    switch(lhs->md_type) {
    case FMS_INTEGER: {
      if(lhs->sub_type.int_type != rhs->sub_type.int_type)
        diff += 100;

      if(lhs->num_entries != rhs->num_entries)
        diff += 1000;

      if(diff == 0) {
        if(CompareIntData(lhs->sub_type.int_type, lhs->num_entries, lhs->data,
                          rhs->data))
          diff += 100000;
      }
      break;
    }
    case FMS_SCALAR: {
      if(lhs->sub_type.scalar_type != rhs->sub_type.scalar_type)
        diff += 100;

      if(lhs->num_entries != rhs->num_entries)
        diff += 1000;

      if(diff == 0) {
        if(CompareScalarData(lhs->sub_type.scalar_type, lhs->num_entries, lhs->data,
                             rhs->data))
          diff += 100000;
      }
      break;
    }
    case FMS_STRING: {
      if(lhs->data && rhs->data) {
        if(strcmp(lhs->data, rhs->data))
          diff += 100000;
      } else if(!lhs->name)
        diff += 100;
      else if(!rhs->name)
        diff += 200;
      break;
    }
    case FMS_META_DATA: {
      if(lhs->num_entries != rhs->num_entries)
        diff += 100;

      if(diff == 0) {
        FmsMetaData *ldata = (FmsMetaData*)lhs->data;
        FmsMetaData *rdata = (FmsMetaData*)rhs->data;
        const FmsInt NE = lhs->num_entries;
        for(FmsInt i = 0; i < NE; i++) {
          diff += FmsMetaDataCompare(ldata[i], rdata[i]);
          if(diff)
            break;
        }
      }
      break;
    }
    default: {
      diff += 1000000;
      break;
    }
    }
  }
  return diff;
}